

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

int ixmlNode_setPrefix(IXML_Node *nodeptr,char *prefix)

{
  char *pcVar1;
  
  if (nodeptr->prefix != (char *)0x0) {
    free(nodeptr->prefix);
    nodeptr->prefix = (char *)0x0;
  }
  if (prefix != (char *)0x0) {
    pcVar1 = strdup(prefix);
    nodeptr->prefix = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return 0x66;
    }
  }
  return 0;
}

Assistant:

static int ixmlNode_setPrefix(
	/*! [in] The \b Node on which to operate. */
	IXML_Node *nodeptr,
	/*! [in] The prefix string to set. */
	const char *prefix)
{
	if (nodeptr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (nodeptr->prefix != NULL) {
		free(nodeptr->prefix);
		nodeptr->prefix = NULL;
	}

	if (prefix != NULL) {
		nodeptr->prefix = strdup(prefix);
		if (nodeptr->prefix == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
	}

	return IXML_SUCCESS;
}